

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O2

void __thiscall agge::tests::LayoutTests::LongSingleLineIsBrokenOnWordBounds(LayoutTests *this)

{
  wrap limiter;
  wrap limiter_00;
  __normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
  end;
  long lVar1;
  factory_ptr f;
  layout l2;
  layout l1;
  char_to_index indices [6];
  allocator local_bc1;
  font_factory *local_bc0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_bb8;
  int local_bb0 [14];
  _Vector_base<agge::text_line,_std::allocator<agge::text_line>_> local_b78;
  _Vector_base<int,_std::allocator<int>_> local_b60;
  ref_glyph_run local_b48;
  string local_b10;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_af0;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_ae0;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_ad0;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_ac0;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_ab0;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_aa0;
  int local_a90 [28];
  _Vector_base<agge::text_line,_std::allocator<agge::text_line>_> local_a20;
  _Vector_base<int,_std::allocator<int>_> local_a08;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_9f0;
  _Vector_base<int,_std::allocator<int>_> local_9d8;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_9c0;
  _Vector_base<int,_std::allocator<int>_> local_9a8;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_990;
  _Vector_base<int,_std::allocator<int>_> local_978;
  undefined4 local_960;
  undefined4 uStack_95c;
  undefined4 uStack_958;
  undefined4 uStack_954;
  undefined4 uStack_950;
  uint uStack_94c;
  undefined4 local_948;
  undefined4 uStack_944;
  undefined4 uStack_940;
  undefined4 uStack_93c;
  undefined4 uStack_938;
  uint uStack_934;
  LocationInfo local_930;
  ref_text_line local_908;
  ref_text_line local_8e0;
  ref_text_line local_8b8;
  ref_text_line local_890;
  undefined1 local_868 [56];
  _Vector_base<int,_std::allocator<int>_> local_830;
  _Vector_base<int,_std::allocator<int>_> local_818;
  _Vector_base<int,_std::allocator<int>_> local_800;
  _Vector_base<int,_std::allocator<int>_> local_7e8;
  _Vector_base<int,_std::allocator<int>_> local_7d0;
  _Vector_base<int,_std::allocator<int>_> local_7b8;
  _Vector_base<int,_std::allocator<int>_> local_7a0;
  _Vector_base<int,_std::allocator<int>_> local_788;
  _Vector_base<int,_std::allocator<int>_> local_770;
  _Vector_base<int,_std::allocator<int>_> local_758;
  _Vector_base<int,_std::allocator<int>_> local_740;
  _Vector_base<int,_std::allocator<int>_> local_728;
  _Vector_base<int,_std::allocator<int>_> local_710;
  _Vector_base<int,_std::allocator<int>_> local_6f8;
  _Vector_base<int,_std::allocator<int>_> local_6e0;
  _Vector_base<int,_std::allocator<int>_> local_6c8;
  _Vector_base<int,_std::allocator<int>_> local_6b0;
  _Vector_base<int,_std::allocator<int>_> local_698;
  _Vector_base<int,_std::allocator<int>_> local_680;
  _Vector_base<int,_std::allocator<int>_> local_668;
  _Vector_base<int,_std::allocator<int>_> local_650;
  _Vector_base<int,_std::allocator<int>_> local_638;
  _Vector_base<int,_std::allocator<int>_> local_620;
  _Vector_base<int,_std::allocator<int>_> local_608;
  _Vector_base<int,_std::allocator<int>_> local_5f0;
  _Vector_base<int,_std::allocator<int>_> local_5d8;
  _Vector_base<int,_std::allocator<int>_> local_5c0;
  _Vector_base<int,_std::allocator<int>_> local_5a8;
  _Vector_base<int,_std::allocator<int>_> local_590;
  _Vector_base<int,_std::allocator<int>_> local_578;
  _Vector_base<int,_std::allocator<int>_> local_560;
  _Vector_base<int,_std::allocator<int>_> local_548;
  _Vector_base<int,_std::allocator<int>_> local_530;
  _Vector_base<int,_std::allocator<int>_> local_518;
  _Vector_base<int,_std::allocator<int>_> local_500;
  _Vector_base<int,_std::allocator<int>_> local_4e8;
  _Vector_base<int,_std::allocator<int>_> local_4d0;
  _Vector_base<int,_std::allocator<int>_> local_4b8;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_4a0;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_488;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_470;
  _Vector_base<int,_std::allocator<int>_> local_458;
  _Vector_base<int,_std::allocator<int>_> local_440;
  _Vector_base<int,_std::allocator<int>_> local_428;
  _Vector_base<int,_std::allocator<int>_> local_410;
  _Vector_base<int,_std::allocator<int>_> local_3f8;
  _Vector_base<int,_std::allocator<int>_> local_3e0;
  _Vector_base<int,_std::allocator<int>_> local_3c8;
  _Vector_base<int,_std::allocator<int>_> local_3b0;
  _Vector_base<int,_std::allocator<int>_> local_398;
  _Vector_base<int,_std::allocator<int>_> local_380;
  _Vector_base<int,_std::allocator<int>_> local_368;
  _Vector_base<int,_std::allocator<int>_> local_350;
  _Vector_base<int,_std::allocator<int>_> local_338;
  _Vector_base<int,_std::allocator<int>_> local_320;
  _Vector_base<int,_std::allocator<int>_> local_308;
  _Vector_base<int,_std::allocator<int>_> local_2f0;
  _Vector_base<int,_std::allocator<int>_> local_2d8;
  _Vector_base<int,_std::allocator<int>_> local_2c0;
  _Vector_base<int,_std::allocator<int>_> local_2a8;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_290;
  richtext_t local_278;
  undefined1 local_210 [56];
  layout local_1d8;
  layout local_188;
  text_line local_138;
  undefined8 uStack_110;
  _Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> local_108;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  end._M_current = &local_138;
  local_138.extent = 5.46506e-44;
  local_138.descent = 5.60519e-45;
  uStack_110 = 0x50000002e;
  local_138.super_range<const_std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>_>.
  _container = (vector<agge::glyph_run,_std::allocator<agge::glyph_run>_> *)0x200000042;
  local_138.offset.dx = 9.3887e-44;
  local_138.offset.dy = 4.2039e-45;
  local_138.super_range<const_std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>_>.
  begin_index = 0x20;
  local_138.super_range<const_std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>_>.
  end_index = 0x100000041;
  local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x401c666666666666;
  local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0 = 0;
  uStack_e8 = 0;
  local_e0 = 0x4026000000000000;
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0x4028000000000000;
  local_b0 = 0;
  uStack_a8 = 0;
  local_a0 = 0;
  uStack_98 = 0;
  local_90 = 0x402a000000000000;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0x4008000000000000;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0x4008000000000000;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  create_single_font_factory<6ul,6ul>
            ((LayoutTests *)&local_bc0,(font_metrics *)this,
             (char_to_index (*) [6])(anonymous_namespace)::c_fm1,(glyph (*) [6])end._M_current);
  layout::layout(&local_188);
  layout::layout(&local_1d8);
  std::__cxx11::string::string((string *)&local_b48,"AAAA BBBB CC BBBB AAAA",(allocator *)local_868)
  ;
  R(&local_278,(string *)&local_b48);
  local_948 = 0x430b199a;
  uStack_944 = 0;
  uStack_940 = 0;
  uStack_93c = 0;
  uStack_938 = 0;
  uStack_934 = uStack_934 & 0xffffff00;
  lVar1 = (ulong)uStack_934 << 0x20;
  limiter._sow.next = (int)lVar1;
  limiter._previous_space = (bool)(char)((ulong)lVar1 >> 0x20);
  limiter._21_3_ = (int3)((ulong)lVar1 >> 0x28);
  limiter._limit = 139.1;
  limiter._eow.extent = 0.0;
  limiter._eow.next = 0;
  limiter._sow.extent = 0.0;
  layout::process<agge::limit::wrap,agge::tests::LayoutTests::font_factory>
            (&local_188,&local_278,limiter,local_bc0);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_278);
  std::__cxx11::string::~string((string *)&local_b48);
  std::__cxx11::string::string
            ((string *)&local_b48,"CCC\'C BBB AA AA AAAABBB CCCC AAAA ABABABABAB.",
             (allocator *)local_868);
  R(&local_278,(string *)&local_b48);
  local_960 = 0x430b199a;
  uStack_95c = 0;
  uStack_958 = 0;
  uStack_954 = 0;
  uStack_950 = 0;
  uStack_94c = uStack_94c & 0xffffff00;
  lVar1 = (ulong)uStack_94c << 0x20;
  limiter_00._sow.next = (int)lVar1;
  limiter_00._previous_space = (bool)(char)((ulong)lVar1 >> 0x20);
  limiter_00._21_3_ = (int3)((ulong)lVar1 >> 0x28);
  limiter_00._limit = 139.1;
  limiter_00._eow.extent = 0.0;
  limiter_00._eow.next = 0;
  limiter_00._sow.extent = 0.0;
  layout::process<agge::limit::wrap,agge::tests::LayoutTests::font_factory>
            (&local_1d8,&local_278,limiter_00,local_bc0);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_278);
  std::__cxx11::string::~string((string *)&local_b48);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_aa0,
             &(local_bc0->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_978._M_impl.super__Vector_impl_data._M_start._0_4_ = 1;
  plural_::operator+((vector<int,_std::allocator<int>_> *)&local_398,(plural_ *)&plural,
                     (int *)&local_978);
  local_990.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_380,
                   (vector<int,_std::allocator<int>_> *)&local_398,(int *)&local_990);
  local_9a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_368,
                   (vector<int,_std::allocator<int>_> *)&local_380,(int *)&local_9a8);
  local_9c0.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_350,
                   (vector<int,_std::allocator<int>_> *)&local_368,(int *)&local_9c0);
  local_9d8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_338,
                   (vector<int,_std::allocator<int>_> *)&local_350,(int *)&local_9d8);
  local_9f0.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_320,
                   (vector<int,_std::allocator<int>_> *)&local_338,(int *)&local_9f0);
  local_a08._M_impl.super__Vector_impl_data._M_start._0_4_ = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_308,
                   (vector<int,_std::allocator<int>_> *)&local_320,(int *)&local_a08);
  local_a20._M_impl.super__Vector_impl_data._M_start._0_4_ = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_2f0,
                   (vector<int,_std::allocator<int>_> *)&local_308,(int *)&local_a20);
  local_bb0[0xd] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_2d8,
                   (vector<int,_std::allocator<int>_> *)&local_2f0,local_bb0 + 0xd);
  local_bb0[0xc] = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_2c0,
                   (vector<int,_std::allocator<int>_> *)&local_2d8,local_bb0 + 0xc);
  local_bb0[0xb] = 3;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_2a8,
                   (vector<int,_std::allocator<int>_> *)&local_2c0,local_bb0 + 0xb);
  local_bb0[10] = 3;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_930,
                   (vector<int,_std::allocator<int>_> *)&local_2a8,local_bb0 + 10);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)&local_278,(shared_ptr<agge::font> *)&local_aa0,0.0,0.0,
             (vector<int,_std::allocator<int>_> *)&local_930);
  plural_::operator+((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>
                      *)&local_908,(plural_ *)&plural,(ref_glyph_run *)&local_278);
  ref_text_line::ref_text_line
            ((ref_text_line *)local_868,0.0,10.0,132.2,
             (vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_908);
  plural_::operator+(&local_290,(plural_ *)&plural,(ref_text_line *)local_868);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_ab0,
             &(local_bc0->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_bb0[9] = 2;
  plural_::operator+((vector<int,_std::allocator<int>_> *)&local_458,(plural_ *)&plural,
                     local_bb0 + 9);
  local_bb0[8] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_440,
                   (vector<int,_std::allocator<int>_> *)&local_458,local_bb0 + 8);
  local_bb0[7] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_428,
                   (vector<int,_std::allocator<int>_> *)&local_440,local_bb0 + 7);
  local_bb0[6] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_410,
                   (vector<int,_std::allocator<int>_> *)&local_428,local_bb0 + 6);
  local_bb0[5] = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_3f8,
                   (vector<int,_std::allocator<int>_> *)&local_410,local_bb0 + 5);
  local_bb0[4] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_3e0,
                   (vector<int,_std::allocator<int>_> *)&local_3f8,local_bb0 + 4);
  local_bb0[3] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_3c8,
                   (vector<int,_std::allocator<int>_> *)&local_3e0,local_bb0 + 3);
  local_bb0[2] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_3b0,
                   (vector<int,_std::allocator<int>_> *)&local_3c8,local_bb0 + 2);
  local_bb0[1] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_b60,
                   (vector<int,_std::allocator<int>_> *)&local_3b0,local_bb0 + 1);
  ref_glyph_run::ref_glyph_run<int>
            (&local_b48,(shared_ptr<agge::font> *)&local_ab0,0.0,0.0,
             (vector<int,_std::allocator<int>_> *)&local_b60);
  plural_::operator+((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>
                      *)&local_b10,(plural_ *)&plural,&local_b48);
  ref_text_line::ref_text_line
            ((ref_text_line *)local_210,0.0,24.0,99.1,
             (vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_b10);
  tests::operator+((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>
                    *)&local_8e0,&local_290,(ref_text_line *)local_210);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            ((vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_b78,
             (tests *)local_188._text_lines.
                      super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                      super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_188._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_finish,end);
  std::__cxx11::string::string
            ((string *)&local_8b8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,(allocator *)local_bb0);
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_890,(string *)&local_8b8,0x17f);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_8e0,(vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_b78,
             (LocationInfo *)&local_890);
  std::__cxx11::string::~string((string *)&local_890);
  std::__cxx11::string::~string((string *)&local_8b8);
  std::_Vector_base<agge::text_line,_std::allocator<agge::text_line>_>::~_Vector_base(&local_b78);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_8e0);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             (local_210 + 0x10));
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_b10);
  ref_glyph_run::~ref_glyph_run(&local_b48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_b60);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_3b0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_3c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_3e0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_3f8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_410);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_428);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_440);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_458);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_ab0._M_refcount);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_290);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             (local_868 + 0x10));
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_908);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)&local_278);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_930);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2a8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2c0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2f0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_308);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_320);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_338);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_350);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_368);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_380);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_398);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_aa0._M_refcount);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_ac0,
             &(local_bc0->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_bb0[0xd] = 3;
  plural_::operator+((vector<int,_std::allocator<int>_> *)&local_5a8,(plural_ *)&plural,
                     local_bb0 + 0xd);
  local_bb0[0xc] = 3;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_590,
                   (vector<int,_std::allocator<int>_> *)&local_5a8,local_bb0 + 0xc);
  local_bb0[0xb] = 3;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_578,
                   (vector<int,_std::allocator<int>_> *)&local_590,local_bb0 + 0xb);
  local_bb0[10] = 4;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_560,
                   (vector<int,_std::allocator<int>_> *)&local_578,local_bb0 + 10);
  local_bb0[9] = 3;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_548,
                   (vector<int,_std::allocator<int>_> *)&local_560,local_bb0 + 9);
  local_bb0[8] = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_530,
                   (vector<int,_std::allocator<int>_> *)&local_548,local_bb0 + 8);
  local_bb0[7] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_518,
                   (vector<int,_std::allocator<int>_> *)&local_530,local_bb0 + 7);
  local_bb0[6] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_500,
                   (vector<int,_std::allocator<int>_> *)&local_518,local_bb0 + 6);
  local_bb0[5] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_4e8,
                   (vector<int,_std::allocator<int>_> *)&local_500,local_bb0 + 5);
  local_bb0[4] = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_4d0,
                   (vector<int,_std::allocator<int>_> *)&local_4e8,local_bb0 + 4);
  local_bb0[3] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_4b8,
                   (vector<int,_std::allocator<int>_> *)&local_4d0,local_bb0 + 3);
  local_bb0[2] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_978,
                   (vector<int,_std::allocator<int>_> *)&local_4b8,local_bb0 + 2);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)&local_278,(shared_ptr<agge::font> *)&local_ac0,0.0,0.0,
             (vector<int,_std::allocator<int>_> *)&local_978);
  plural_::operator+((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>
                      *)&local_b78,(plural_ *)&plural,(ref_glyph_run *)&local_278);
  ref_text_line::ref_text_line
            (&local_890,0.0,10.0,127.2,
             (vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_b78);
  plural_::operator+(&local_4a0,(plural_ *)&plural,&local_890);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_ad0,
             &(local_bc0->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_bb0[1] = 1;
  plural_::operator+((vector<int,_std::allocator<int>_> *)&local_680,(plural_ *)&plural,
                     local_bb0 + 1);
  local_bb0[0] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_668,
                   (vector<int,_std::allocator<int>_> *)&local_680,local_bb0);
  local_a90[0x1b] = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_650,
                   (vector<int,_std::allocator<int>_> *)&local_668,local_a90 + 0x1b);
  local_a90[0x1a] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_638,
                   (vector<int,_std::allocator<int>_> *)&local_650,local_a90 + 0x1a);
  local_a90[0x19] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_620,
                   (vector<int,_std::allocator<int>_> *)&local_638,local_a90 + 0x19);
  local_a90[0x18] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_608,
                   (vector<int,_std::allocator<int>_> *)&local_620,local_a90 + 0x18);
  local_a90[0x17] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_5f0,
                   (vector<int,_std::allocator<int>_> *)&local_608,local_a90 + 0x17);
  local_a90[0x16] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_5d8,
                   (vector<int,_std::allocator<int>_> *)&local_5f0,local_a90 + 0x16);
  local_a90[0x15] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_5c0,
                   (vector<int,_std::allocator<int>_> *)&local_5d8,local_a90 + 0x15);
  local_a90[0x14] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_9a8,
                   (vector<int,_std::allocator<int>_> *)&local_5c0,local_a90 + 0x14);
  ref_glyph_run::ref_glyph_run<int>
            (&local_b48,(shared_ptr<agge::font> *)&local_ad0,0.0,0.0,
             (vector<int,_std::allocator<int>_> *)&local_9a8);
  plural_::operator+(&local_990,(plural_ *)&plural,&local_b48);
  ref_text_line::ref_text_line(&local_8b8,0.0,24.0,109.1,&local_990);
  tests::operator+(&local_488,&local_4a0,&local_8b8);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_ae0,
             &(local_bc0->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_a90[0x13] = 3;
  plural_::operator+((vector<int,_std::allocator<int>_> *)&local_740,(plural_ *)&plural,
                     local_a90 + 0x13);
  local_a90[0x12] = 3;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_728,
                   (vector<int,_std::allocator<int>_> *)&local_740,local_a90 + 0x12);
  local_a90[0x11] = 3;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_710,
                   (vector<int,_std::allocator<int>_> *)&local_728,local_a90 + 0x11);
  local_a90[0x10] = 3;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_6f8,
                   (vector<int,_std::allocator<int>_> *)&local_710,local_a90 + 0x10);
  local_a90[0xf] = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_6e0,
                   (vector<int,_std::allocator<int>_> *)&local_6f8,local_a90 + 0xf);
  local_a90[0xe] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_6c8,
                   (vector<int,_std::allocator<int>_> *)&local_6e0,local_a90 + 0xe);
  local_a90[0xd] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_6b0,
                   (vector<int,_std::allocator<int>_> *)&local_6c8,local_a90 + 0xd);
  local_a90[0xc] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_698,
                   (vector<int,_std::allocator<int>_> *)&local_6b0,local_a90 + 0xc);
  local_a90[0xb] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_9d8,
                   (vector<int,_std::allocator<int>_> *)&local_698,local_a90 + 0xb);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)local_868,(shared_ptr<agge::font> *)&local_ae0,0.0,0.0,
             (vector<int,_std::allocator<int>_> *)&local_9d8);
  plural_::operator+(&local_9c0,(plural_ *)&plural,(ref_glyph_run *)local_868);
  ref_text_line::ref_text_line(&local_8e0,0.0,38.0,103.1,&local_9c0);
  tests::operator+(&local_470,&local_488,&local_8e0);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_af0,
             &(local_bc0->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_a90[10] = 1;
  plural_::operator+((vector<int,_std::allocator<int>_> *)&local_830,(plural_ *)&plural,
                     local_a90 + 10);
  local_a90[9] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_818,
                   (vector<int,_std::allocator<int>_> *)&local_830,local_a90 + 9);
  local_a90[8] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_800,
                   (vector<int,_std::allocator<int>_> *)&local_818,local_a90 + 8);
  local_a90[7] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_7e8,
                   (vector<int,_std::allocator<int>_> *)&local_800,local_a90 + 7);
  local_a90[6] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_7d0,
                   (vector<int,_std::allocator<int>_> *)&local_7e8,local_a90 + 6);
  local_a90[5] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_7b8,
                   (vector<int,_std::allocator<int>_> *)&local_7d0,local_a90 + 5);
  local_a90[4] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_7a0,
                   (vector<int,_std::allocator<int>_> *)&local_7b8,local_a90 + 4);
  local_a90[3] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_788,
                   (vector<int,_std::allocator<int>_> *)&local_7a0,local_a90 + 3);
  local_a90[2] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_770,
                   (vector<int,_std::allocator<int>_> *)&local_788,local_a90 + 2);
  local_a90[1] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_758,
                   (vector<int,_std::allocator<int>_> *)&local_770,local_a90 + 1);
  local_a90[0] = 5;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_a08,
                   (vector<int,_std::allocator<int>_> *)&local_758,local_a90);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)local_210,(shared_ptr<agge::font> *)&local_af0,0.0,0.0,
             (vector<int,_std::allocator<int>_> *)&local_a08);
  plural_::operator+(&local_9f0,(plural_ *)&plural,(ref_glyph_run *)local_210);
  ref_text_line::ref_text_line(&local_908,0.0,52.0,118.0,&local_9f0);
  tests::operator+((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>
                    *)&local_b60,&local_470,&local_908);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            ((vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_a20,
             (tests *)local_1d8._text_lines.
                      super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                      super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_1d8._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_finish,end);
  std::__cxx11::string::string
            ((string *)&local_b10,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_bc1);
  ut::LocationInfo::LocationInfo(&local_930,&local_b10,0x186);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_b60,(vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_a20,
             &local_930);
  std::__cxx11::string::~string((string *)&local_930);
  std::__cxx11::string::~string((string *)&local_b10);
  std::_Vector_base<agge::text_line,_std::allocator<agge::text_line>_>::~_Vector_base(&local_a20);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_b60);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_908._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_9f0);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)local_210);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a08);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_758);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_770);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_788);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_7a0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_7b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_7d0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_7e8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_800);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_818);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_830);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_af0._M_refcount);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_470);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_8e0._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_9c0);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)local_868);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_9d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_698);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_6b0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_6c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_6e0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_6f8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_710);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_728);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_740);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_ae0._M_refcount);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_488);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_8b8._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_990);
  ref_glyph_run::~ref_glyph_run(&local_b48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_9a8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_5c0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_5d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_5f0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_608);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_620);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_638);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_650);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_668);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_680);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_ad0._M_refcount);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_4a0);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_890._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_b78);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)&local_278);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_978);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_4b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_4d0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_4e8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_500);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_518);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_530);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_548);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_560);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_578);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_590);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_5a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_ac0._M_refcount);
  layout::~layout(&local_1d8);
  layout::~layout(&local_188);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_bb8);
  lVar1 = 0xd8;
  do {
    std::_Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::
    ~_Vector_base((_Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *
                  )((long)&local_108._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

test( LongSingleLineIsBrokenOnWordBounds )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = {
					{ L' ', 0 }, { L'A', 1 }, { L'B', 2 }, { L'C', 3 }, { L'\'', 4 }, { L'.', 5 },
				};
				mocks::font_accessor::glyph glyphs[] = {
					{ { 7.1, 0 } },
					{ { 11, 0 } },
					{ { 12, 0 } },
					{ { 13, 0 } },
					{ { 3, 0 } },
					{ { 3, 0 } },
				};
				factory_ptr f = create_single_font_factory(c_fm1, indices, glyphs);
				layout::const_iterator gr;

				layout l1;
				layout l2;

				// ACT
				// 44 + 7.1 + 48 + 7.1 + 26 + 7.1 + 48 + 7.1 + 44
				// AAAA BBBB CC|BBBB AAAA
				l1.process (R("AAAA BBBB CC BBBB AAAA"), limit::wrap(139.1f), *f);

				// 55 + 7.1 + 36 + 7.1 + 22 + 7.1 + 22 + 7.1 + 80 + 7.1 + 52 + 7.1 + 44 + 7.1 + 118
				// CCC'C BBB AA|AA AAAABBB|CCCC AAAA|ABABABABAB.
				l2.process(R("CCC'C BBB AA AA AAAABBB CCCC AAAA ABABABABAB."), limit::wrap(139.1f), *f);

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 132.2f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 1 + 1 + 1 + 0 + 2 + 2 + 2 + 2 + 0 + 3 + 3))
					+ ref_text_line(0.0f, 24.0f, 99.1f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 2 + 2 + 2 + 2 + 0 + 1 + 1 + 1 + 1)),
					mkvector(l1.begin(), l1.end()));

				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 127.2f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 3 + 3 + 3 + 4 + 3 + 0 + 2 + 2 + 2 + 0 + 1 + 1))
					+ ref_text_line(0.0f, 24.0f, 109.1f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 1 + 0 + 1 + 1 + 1 + 1 + 2 + 2 + 2))
					+ ref_text_line(0.0f, 38.0f, 103.1f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 3 + 3 + 3 +3 + 0 + 1 + 1 + 1 + 1))
					+ ref_text_line(0.0f, 52.0f, 118.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 2 + 1 + 2 + 1 + 2 + 1 + 2 + 1 + 2 + 5)),
					mkvector(l2.begin(), l2.end()));
			}